

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O0

void __thiscall
nesvis::MemoryWidget::draw_mem_value
          (MemoryWidget *this,uint16_t address,optional<unsigned_char> *mem_value)

{
  ImVec2 IVar1;
  bool bVar2;
  uchar *puVar3;
  byte *pbVar4;
  ImDrawList *this_00;
  undefined6 in_register_00000032;
  v8 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  ImVec2 local_104;
  undefined4 local_fc;
  float fStack_f8;
  ImU32 color;
  ImVec2 pos;
  string local_e0;
  optional<unsigned_char> *local_c0;
  optional<unsigned_char> *mem_value_local;
  MemoryWidget *pMStack_b0;
  uint16_t address_local;
  MemoryWidget *this_local;
  undefined1 local_90 [16];
  v8 *local_80;
  char *local_78;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short> *local_70
  ;
  char *local_68;
  undefined8 uStack_60;
  string *local_58;
  char **local_50;
  v8 *local_48;
  char *pcStack_40;
  MemoryWidget **local_38;
  undefined1 *local_30;
  MemoryWidget **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  MemoryWidget **local_10;
  
  this_01 = (v8 *)CONCAT62(in_register_00000032,address);
  local_c0 = mem_value;
  mem_value_local._6_2_ = address;
  pMStack_b0 = this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)mem_value);
  if (bVar2) {
    puVar3 = std::optional<unsigned_char>::value(local_c0);
    if (*puVar3 == '\0') {
      ImGui::TextDisabled("00");
    }
    else {
      pbVar4 = std::optional<unsigned_char>::value(local_c0);
      this_01 = (v8 *)(ulong)*pbVar4;
      ImGui::Text("%02hhX");
    }
  }
  else {
    ImGui::TextDisabled(" -");
  }
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    pos = (ImVec2)((long)"${:04X}" + 1);
    local_68 = "{:04X}";
    uStack_60 = 6;
    local_70 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short>
                *)((long)&mem_value_local + 6);
    local_50 = &local_68;
    local_80 = (v8 *)0x29c101;
    local_78 = (char *)0x6;
    local_58 = &local_e0;
    local_48 = local_80;
    pcStack_40 = local_78;
    this_local = (MemoryWidget *)
                 ::fmt::v8::
                 make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short&>
                           (local_70,this_01,(unsigned_short *)&local_e0);
    local_30 = local_90;
    local_38 = &this_local;
    local_20 = 2;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 2;
    fmt.data_ = local_78;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v8::vformat_abi_cxx11_(&local_e0,local_80,fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->goto_address_input_,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    IVar1 = ImGui::GetItemRectMin();
    fStack_f8 = IVar1.x;
    fStack_f8 = fStack_f8 - 4.0;
    color = (ImU32)IVar1.y;
    color = (ImU32)((float)color - 4.0);
    local_fc = 0x64969696;
    this_00 = ImGui::GetWindowDrawList();
    ImVec2::ImVec2(&local_104,fStack_f8 + 24.0,(float)color + 24.0);
    ImDrawList::AddRectFilled
              (this_00,(ImVec2 *)&stack0xffffffffffffff08,&local_104,0x64969696,0.0,0);
    ImGui::BeginTooltip();
    ImGui::Text("%04hX",(ulong)mem_value_local._6_2_);
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

void draw_mem_value(uint16_t address,
            const std::optional<uint8_t> &mem_value) {
        if (mem_value) {
            if (mem_value.value() == 0u) {
                ImGui::TextDisabled("00");
            } else {
                ImGui::Text("%02hhX", mem_value.value());
            }
        } else {
            ImGui::TextDisabled(" -");
        }

        if (ImGui::IsItemHovered()) {
            goto_address_input_ = fmt::format("{:04X}", address);

            ImVec2 pos = ImGui::GetItemRectMin();
            pos.x -= 4;
            pos.y -= 4;
            const auto color = IM_COL32(150u, 150u, 150u, 100u);
            ImGui::GetWindowDrawList()->AddRectFilled(
                    pos, ImVec2(pos.x + 24, pos.y + 24), color);

            ImGui::BeginTooltip();
            ImGui::Text("%04hX", address);
            ImGui::EndTooltip();
        }
    }